

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVectorBase<(anonymous_namespace)::Constructable>::resize
          (SmallVectorBase<(anonymous_namespace)::Constructable> *this,size_t newSize,
          Constructable *value)

{
  size_type in_stack_00000018;
  SmallVectorBase<(anonymous_namespace)::Constructable> *in_stack_00000020;
  
  resizeImpl<(anonymous_namespace)::Constructable>
            (in_stack_00000020,in_stack_00000018,(Constructable *)this);
  return;
}

Assistant:

void resize(size_t newSize, const T& value) { resizeImpl(newSize, value); }